

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_p.h
# Opt level: O3

void __thiscall QShortcutPrivate::~QShortcutPrivate(QShortcutPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)this = &PTR__QShortcutPrivate_007e0988;
  pDVar1 = (this->sc_ids).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->sc_ids).d.d)->super_QArrayData,4,0x10);
    }
  }
  pDVar2 = (this->sc_whatsthis).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->sc_whatsthis).d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QKeySequence>::~QArrayDataPointer(&(this->sc_sequences).d);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  operator_delete(this,200);
  return;
}

Assistant:

class Q_GUI_EXPORT QShortcutPrivate : public QObjectPrivate
{
    Q_DECLARE_PUBLIC(QShortcut)
public:
    QShortcutPrivate() = default;

    virtual QShortcutMap::ContextMatcher contextMatcher() const;
    virtual bool handleWhatsThis() { return false; }

    static bool simpleContextMatcher(QObject *object, Qt::ShortcutContext context);

    QList<QKeySequence> sc_sequences;
    QString sc_whatsthis;
    Qt::ShortcutContext sc_context = Qt::WindowShortcut;
    bool sc_enabled = true;
    bool sc_autorepeat = true;
    QList<int> sc_ids;
    void redoGrab(QShortcutMap &map);
}